

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

void filter_run(filter *f,float in,float *out)

{
  int iVar1;
  float fVar2;
  float *ptr;
  float *out_local;
  float in_local;
  filter *f_local;
  
  iVar1 = f->pointer;
  f->pointer = iVar1 + 1;
  f->buffer[iVar1] = in;
  fVar2 = filter_mac(f->buffer + iVar1 + -(long)f->length,f->taps,f->length);
  *out = fVar2;
  if (f->pointer == 0x400) {
    memcpy(f->buffer,(void *)((long)f + (long)f->length * -4 + 0x1010),(long)f->length << 2);
    f->pointer = f->length;
  }
  return;
}

Assistant:

void filter_run(struct filter *f, float in, float *out)
{
	float *ptr = f->buffer + f->pointer++;

	*ptr = in;
	
	// TODO: optimize: pass filter length as constant to enable
	// using optimized __mac_c and fix the number of rounds there!
	#ifndef	__HAVE_ARCH_MAC
	*out = filter_mac(ptr - f->length, f->taps, f->length);
	#else
	*out = mac(ptr - f->length, f->taps, f->length);
	#endif
	//*out = filter_mac(ptr - f->length, f->taps, 53);

	if (f->pointer == BufferLen) {
		memcpy(f->buffer, 
		       f->buffer + BufferLen - f->length,
		       f->length * sizeof(float));
		f->pointer = f->length;
	}
}